

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-strip.cc
# Opt level: O3

int ProgramMain(int argc,char **argv)

{
  _Alloc_hider _Var1;
  Result RVar2;
  Result RVar3;
  wabt *this;
  char *out_data;
  string_view filename;
  string_view filename_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  OptionParser parser;
  Errors errors;
  _Any_data local_198;
  code *local_188;
  code *local_180;
  undefined4 local_178;
  void *local_168;
  long lStack_160;
  long local_158;
  _Any_data local_148;
  code *local_138;
  code *local_130;
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [48];
  _Any_data local_b8;
  _Manager_type local_a8;
  Errors local_98;
  Features local_72;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_60;
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            ((OptionParser *)local_128,"wasm-strip",
             "  Remove sections of a WebAssembly binary file.\n\nexamples:\n  # Remove all custom sections from test.wasm\n  $ wasm-strip test.wasm\n"
            );
  local_188 = (code *)0x656d616e656c6966;
  local_198._8_8_ = 8;
  local_180 = (code *)((ulong)local_180 & 0xffffffffffffff00);
  local_148._M_unused._M_object = (code **)0x0;
  local_148._8_8_ = 0;
  local_130 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm-strip.cc:44:22)>
              ::_M_invoke;
  local_138 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm-strip.cc:44:22)>
              ::_M_manager;
  local_198._M_unused._M_object = &local_188;
  wabt::OptionParser::AddArgument
            ((OptionParser *)local_128,(string *)&local_198,One,(Callback *)&local_148);
  if (local_138 != (code *)0x0) {
    (*local_138)(&local_148,&local_148,3);
  }
  if ((code **)local_198._M_unused._0_8_ != &local_188) {
    operator_delete(local_198._M_unused._M_object,(ulong)(local_188 + 1));
  }
  local_198._M_unused._M_object = (void *)0x0;
  local_198._8_8_ = 0;
  local_180 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm-strip.cc:49:20)>
              ::_M_invoke;
  local_188 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm-strip.cc:49:20)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_128,'o',"output","FILE","output wasm binary file",
             (Callback *)&local_198);
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,3);
  }
  local_198._M_unused._M_object = (void *)0x0;
  local_198._8_8_ = 0;
  local_180 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm-strip.cc:52:20)>
              ::_M_invoke;
  local_188 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm-strip.cc:52:20)>
              ::_M_manager;
  out_data = "SECTION NAME";
  wabt::OptionParser::AddOption
            ((OptionParser *)local_128,'k',"keep-section","SECTION NAME",
             "Section name to keep in the final output",(Callback *)&local_198);
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,3);
  }
  wabt::OptionParser::Parse((OptionParser *)local_128,argc,argv);
  if (local_a8 != (_Manager_type)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::~vector
            ((vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_> *)
             (local_e8 + 0x18));
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
            ((vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *)
             local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p,(ulong)(local_f8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._0_8_ != &local_118) {
    operator_delete((void *)local_128._0_8_,local_118._M_allocated_capacity + 1);
  }
  _Var1._M_p = s_filename_abi_cxx11_._M_dataplus._M_p;
  local_168 = (void *)0x0;
  lStack_160 = 0;
  local_158 = 0;
  this = (wabt *)strlen(s_filename_abi_cxx11_._M_dataplus._M_p);
  filename._M_str = (char *)&local_168;
  filename._M_len = (size_t)_Var1._M_p;
  RVar2 = wabt::ReadFile(this,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)out_data);
  RVar3.enum_ = Error;
  if (RVar2.enum_ != Error) {
    local_98.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_72.exceptions_enabled_ = false;
    local_72.mutable_globals_enabled_ = true;
    local_72.sat_float_to_int_enabled_ = true;
    local_72.sign_extension_enabled_ = true;
    local_72.simd_enabled_ = true;
    local_72.threads_enabled_ = false;
    local_72.function_references_enabled_ = false;
    local_72.multi_value_enabled_ = true;
    local_72.tail_call_enabled_ = false;
    local_72.bulk_memory_enabled_ = true;
    local_72.reference_types_enabled_ = true;
    local_72.annotations_enabled_ = false;
    local_72.code_metadata_enabled_ = false;
    local_72.gc_enabled_ = false;
    local_72.memory64_enabled_ = false;
    local_72.multi_memory_enabled_ = false;
    local_72.extended_const_enabled_ = false;
    local_72.relaxed_simd_enabled_ = false;
    wabt::Features::EnableAll(&local_72);
    local_188 = (code *)CONCAT62(local_188._2_6_,local_72._16_2_);
    local_198._M_unused._M_member_pointer = CONCAT71(local_72._1_7_,local_72.exceptions_enabled_);
    local_198._8_8_ =
         CONCAT17(local_72.multi_memory_enabled_,
                  CONCAT43(local_72._11_4_,CONCAT21(local_72._9_2_,local_72.tail_call_enabled_)));
    local_180 = (code *)0x0;
    local_178 = 0x100;
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::_Rb_tree(&local_60,&v_sections_to_keep._M_t);
    BinaryReaderStrip::BinaryReaderStrip
              ((BinaryReaderStrip *)local_128,
               (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)&local_60,&local_98);
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
    RVar2 = wabt::ReadBinary(local_168,lStack_160 - (long)local_168,
                             (BinaryReaderDelegate *)local_128,(ReadBinaryOptions *)&local_198);
    local_148._8_8_ = 0;
    local_138 = (code *)((ulong)local_138 & 0xffffffffffffff00);
    RVar3.enum_ = Error;
    local_148._M_unused._M_object = &local_138;
    wabt::FormatErrorsToFile
              (&local_98,Binary,(LexerSourceLineFinder *)0x0,_stderr,(string *)&local_148,Never,0x50
              );
    if ((code **)local_148._M_unused._0_8_ != &local_138) {
      operator_delete(local_148._M_unused._M_object,(ulong)(local_138 + 1));
    }
    if (RVar2.enum_ != Error) {
      if (s_outfile_abi_cxx11_._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&s_outfile_abi_cxx11_);
      }
      filename_00._M_str = s_outfile_abi_cxx11_._M_dataplus._M_p;
      filename_00._M_len = s_outfile_abi_cxx11_._M_string_length;
      RVar3 = wabt::OutputBuffer::WriteToFile
                        ((OutputBuffer *)local_f8._M_allocated_capacity,filename_00);
    }
    local_128._0_8_ = &PTR__BinaryReaderStrip_00132cf0;
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::_M_erase((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)local_e8,(_Link_type)local_e8._16_8_);
    local_118._M_allocated_capacity = (size_type)&PTR__MemoryStream_001335e0;
    if ((OutputBuffer *)local_f8._M_allocated_capacity != (OutputBuffer *)0x0) {
      std::default_delete<wabt::OutputBuffer>::operator()
                ((default_delete<wabt::OutputBuffer> *)local_f8._M_local_buf,
                 (OutputBuffer *)local_f8._M_allocated_capacity);
    }
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_98);
  }
  if (local_168 != (void *)0x0) {
    operator_delete(local_168,local_158 - (long)local_168);
  }
  return RVar3.enum_;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  result = ReadFile(s_filename.c_str(), &file_data);
  if (Failed(result)) {
    return Result::Error;
  }

  Errors errors;
  Features features;
  features.EnableAll();
  const bool kReadDebugNames = false;
  const bool kStopOnFirstError = true;
  const bool kFailOnCustomSectionError = false;
  ReadBinaryOptions options(features, nullptr, kReadDebugNames,
                            kStopOnFirstError, kFailOnCustomSectionError);

  BinaryReaderStrip reader(v_sections_to_keep, &errors);
  result = ReadBinary(file_data.data(), file_data.size(), &reader, options);
  FormatErrorsToFile(errors, Location::Type::Binary);
  if (Failed(result)) {
    return Result::Error;
  }

  if (s_outfile.empty()) {
    s_outfile = s_filename;
  }
  return reader.WriteToFile(s_outfile);
}